

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

void cconv_array_init(CTState *cts,CType *d,CTSize sz,uint8_t *dp,TValue *o,MSize len)

{
  uint uVar1;
  TValue *pTVar2;
  void *in_RCX;
  uint in_EDX;
  TValue *in_RSI;
  CTState *in_RDI;
  uint in_R9D;
  MSize i;
  CTSize esize;
  CTSize ofs;
  CType *dc;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  uint uVar3;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar5;
  TValue *local_40;
  CTState *dp_00;
  undefined4 in_stack_ffffffffffffffe0;
  CTState *cts_00;
  
  pTVar2 = in_RSI;
  do {
    local_40 = pTVar2;
    uVar1 = (local_40->u32).lo & 0xffff;
    pTVar2 = (TValue *)(in_RDI->tab + uVar1);
  } while ((pTVar2->u32).lo >> 0x1c == 8);
  uVar4 = (pTVar2->field_2).it;
  if (in_R9D * uVar4 <= in_EDX) {
    uVar5 = 0;
    dp_00 = in_RDI;
    cts_00 = in_RDI;
    for (uVar3 = 0; uVar3 < in_R9D; uVar3 = uVar3 + 1) {
      lj_cconv_ct_tv(cts_00,(CType *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),(uint8_t *)dp_00,
                     local_40,(CTInfo)((ulong)in_RDI >> 0x20));
      uVar5 = uVar4 + uVar5;
    }
    if (uVar5 == uVar4) {
      for (; uVar5 < in_EDX; uVar5 = uVar4 + uVar5) {
        memcpy((void *)((long)in_RCX + (ulong)uVar5),in_RCX,(ulong)uVar4);
      }
    }
    else {
      memset((void *)((long)in_RCX + (ulong)uVar5),0,(ulong)(in_EDX - uVar5));
    }
    return;
  }
  cconv_err_initov((CTState *)CONCAT44(in_stack_ffffffffffffff84,uVar4),
                   (CType *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
}

Assistant:

static void cconv_array_init(CTState *cts, CType *d, CTSize sz, uint8_t *dp,
			     TValue *o, MSize len)
{
  CType *dc = ctype_rawchild(cts, d);  /* Array element type. */
  CTSize ofs, esize = dc->size;
  MSize i;
  if (len*esize > sz)
    cconv_err_initov(cts, d);
  for (i = 0, ofs = 0; i < len; i++, ofs += esize)
    lj_cconv_ct_tv(cts, dc, dp + ofs, o + i, 0);
  if (ofs == esize) {  /* Replicate a single element. */
    for (; ofs < sz; ofs += esize) memcpy(dp + ofs, dp, esize);
  } else {  /* Otherwise fill the remainder with zero. */
    memset(dp + ofs, 0, sz - ofs);
  }
}